

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int lj_cf_jit_util_funcuvname(lua_State *L)

{
  TValue *pTVar1;
  uint idx_00;
  GCproto *pt_00;
  char *str;
  char *__s;
  size_t lenx;
  GCstr *pGVar2;
  bool bVar3;
  uint32_t idx;
  GCproto *pt;
  lua_State *L_local;
  
  pt_00 = check_Lproto(L,0);
  idx_00 = lj_lib_checkint(L,2);
  bVar3 = idx_00 < pt_00->sizeuv;
  if (bVar3) {
    pTVar1 = L->top;
    str = lj_debug_uvname(pt_00,idx_00);
    __s = lj_debug_uvname(pt_00,idx_00);
    lenx = strlen(__s);
    pGVar2 = lj_str_new(L,str,lenx);
    pTVar1[-1].u64 = (ulong)pGVar2 | 0xfffd800000000000;
  }
  L_local._4_4_ = (uint)bVar3;
  return L_local._4_4_;
}

Assistant:

LJLIB_CF(jit_util_funcuvname)
{
  GCproto *pt = check_Lproto(L, 0);
  uint32_t idx = (uint32_t)lj_lib_checkint(L, 2);
  if (idx < pt->sizeuv) {
    setstrV(L, L->top-1, lj_str_newz(L, lj_debug_uvname(pt, idx)));
    return 1;
  }
  return 0;
}